

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::fan_reduce_tmpl<Omega_h::SumFunctor<long>>
          (Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width)

{
  Alloc *pAVar1;
  int iVar2;
  ulong uVar3;
  void *extraout_RDX;
  size_t sVar4;
  Read<signed_char> RVar5;
  Write<signed_char> a_data;
  type f;
  allocator local_89;
  Write<long> local_88;
  Write<int> local_78;
  type local_68;
  
  iVar2 = Read<int>::last((Read<signed_char> *)a2b);
  pAVar1 = (b_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if (iVar2 * width == (int)(uVar3 >> 3)) {
    pAVar1 = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar4 = pAVar1->size;
    }
    else {
      sVar4 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_68,"",&local_89);
    iVar2 = (int)(sVar4 >> 2) + -1;
    Write<long>::Write(&local_88,iVar2 * width,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    local_68.width = width;
    Write<int>::Write(&local_68.a2b.write_,&a2b->write_);
    Write<long>::Write((Write<int> *)&local_68.b_data,(Write<int> *)b_data);
    Write<long>::Write((Write<int> *)&local_68.a_data,(Write<int> *)&local_88);
    parallel_for<Omega_h::fan_reduce_tmpl<Omega_h::SumFunctor<long>>(Omega_h::Read<int>,Omega_h::Read<Omega_h::SumFunctor<long>::input_type>,int)::_lambda(int)_1_>
              (iVar2,&local_68,"fan_reduce");
    Write<long>::Write(&local_78,(Write<int> *)&local_88);
    Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_78);
    Write<long>::~Write((Write<long> *)&local_78);
    fan_reduce_tmpl<Omega_h::SumFunctor<long>>(Omega_h::Read<int>,Omega_h::Read<Omega_h::SumFunctor<long>::input_type>,int)
    ::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_68);
    Write<long>::~Write(&local_88);
    RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a2b.last() * width == b_data.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x127);
}

Assistant:

Read<typename Functor::input_type> fan_reduce_tmpl(
    LOs a2b, Read<typename Functor::input_type> b_data, Int width) {
  using T = typename Functor::input_type;
  using VT = typename Functor::value_type;
  OMEGA_H_CHECK(a2b.last() * width == b_data.size());
  auto na = a2b.size() - 1;
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto functor = Functor();
    for (Int j = 0; j < width; ++j) {
      VT res;
      functor.init(res);
      for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
        VT update = b_data[b * width + j];
        functor.join(res, update);
      }
      a_data[a * width + j] = static_cast<T>(res);
    }
  };
  parallel_for(na, f, "fan_reduce");
  return a_data;
}